

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

Gia_Man_t * Bmc_SuperBuildTents(Gia_Man_t *p,Vec_Int_t **pvMap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  Vec_Int_t *p_06;
  Vec_Int_t *p_07;
  Vec_Int_t *p_08;
  Vec_Int_t *p_09;
  Vec_Int_t *p_10;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_11;
  char *pcVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  
  p_00 = Vec_IntAlloc(1000);
  p_01 = Vec_IntAlloc(1000);
  p_02 = Vec_IntAlloc(1000);
  p_03 = Vec_IntAlloc(1000);
  p_04 = Vec_IntAlloc(1000);
  p_05 = Vec_IntAlloc(1000);
  p_06 = Vec_IntAlloc(1000);
  p_07 = Vec_IntAlloc(1000);
  p_08 = Vec_IntAlloc(1000);
  p_09 = Vec_IntAlloc(1000);
  p_10 = Vec_IntAlloc(1000);
  iVar8 = 0;
  while ((iVar8 < p->vCos->nSize - p->nRegs &&
         (pGVar5 = Gia_ManCo(p,iVar8), pGVar5 != (Gia_Obj_t *)0x0))) {
    iVar1 = Gia_ObjId(p,pGVar5);
    Vec_IntPush(p_02,iVar1);
    iVar8 = iVar8 + 1;
  }
  Gia_ManCleanMark01(p);
  iVar1 = 0;
  iVar8 = 0;
  while (iVar2 = Vec_IntEntryLast(p_02), iVar8 < iVar2) {
    Vec_IntPush(p_04,p_00->nSize);
    Vec_IntPush(p_05,p_01->nSize);
    Vec_IntPush(p_06,p_02->nSize);
    Vec_IntPush(p_07,p_03->nSize);
    iVar3 = Vec_IntEntryLast(p_02);
    for (iVar2 = iVar8; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      Vec_IntEntry(p_02,iVar2);
      Gia_ManIncrementTravId(p);
      pGVar5 = Gia_ManObj(p,iVar8);
      Bmc_SuperBuildTents_rec
                (p,iVar8 - (*(uint *)pGVar5 & 0x1fffffff),p_00,p_01,p_02,p_03,p_08,p_09,iVar1);
    }
    iVar1 = iVar1 + 1;
    iVar8 = iVar3;
  }
  Gia_ManCleanMark01(p);
  Vec_IntPush(p_04,p_00->nSize);
  Vec_IntPush(p_05,p_01->nSize);
  Vec_IntPush(p_06,p_02->nSize);
  Vec_IntPush(p_07,p_03->nSize);
  p_11 = Gia_ManStart(p->nObjs);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_11->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_11->pSpec = pcVar6;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar8 = 0; iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar8);
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar4 = Gia_ManAppendCi(p_11);
    pGVar5->Value = uVar4;
  }
  for (iVar8 = 0; iVar8 < p_01->nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar8);
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar4 = Gia_ManAppendCi(p_11);
    pGVar5->Value = uVar4;
  }
  for (; -1 < iVar1; iVar1 = iVar1 + -1) {
    iVar8 = Vec_IntEntry(p_06,iVar1);
    for (; iVar2 = Vec_IntEntry(p_06,iVar1 + 1), iVar8 < iVar2; iVar8 = iVar8 + 1) {
      iVar2 = Vec_IntEntry(p_02,iVar8);
      pGVar5 = Gia_ManObj(p,iVar2);
      uVar4 = Gia_ObjFanin0Copy(pGVar5);
      pGVar5->Value = uVar4;
    }
    for (iVar8 = Vec_IntEntry(p_07,iVar1); iVar2 = Vec_IntEntry(p_07,iVar1 + 1), iVar8 < iVar2;
        iVar8 = iVar8 + 1) {
      iVar2 = Vec_IntEntry(p_03,iVar8);
      pGVar5 = Gia_ManObj(p,iVar2);
      uVar4 = Gia_ObjFanin0Copy(pGVar5);
      pGVar5->Value = uVar4;
    }
  }
  iVar8 = 0;
  while ((iVar8 < p->vCos->nSize - p->nRegs &&
         (pGVar5 = Gia_ManCo(p,iVar8), pGVar5 != (Gia_Obj_t *)0x0))) {
    iVar1 = Gia_ObjFanin0Copy(pGVar5);
    Gia_ManAppendCo(p_11,iVar1);
    iVar8 = iVar8 + 1;
  }
  iVar8 = 0;
  do {
    iVar1 = p_01->nSize;
    if (iVar1 <= iVar8) {
LAB_0047f479:
      Gia_ManSetRegNum(p_11,iVar1);
      for (iVar8 = 0; iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
        iVar1 = Vec_IntEntry(p_00,iVar8);
        iVar2 = Vec_IntEntry(p_08,iVar8);
        Vec_IntPushTwo(p_10,iVar1,iVar2);
      }
      for (iVar8 = 0; iVar8 < p_01->nSize; iVar8 = iVar8 + 1) {
        iVar1 = Vec_IntEntry(p_01,iVar8);
        iVar2 = Vec_IntEntry(p_09,iVar8);
        Vec_IntPushTwo(p_10,iVar1,iVar2);
      }
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      Vec_IntFree(p_02);
      Vec_IntFree(p_03);
      Vec_IntFree(p_04);
      Vec_IntFree(p_05);
      Vec_IntFree(p_06);
      Vec_IntFree(p_07);
      Vec_IntFree(p_08);
      Vec_IntFree(p_09);
      if (pvMap == (Vec_Int_t **)0x0) {
        Vec_IntFree(p_10);
      }
      else {
        *pvMap = p_10;
      }
      pGVar7 = Gia_ManCleanup(p_11);
      Gia_ManStop(p_11);
      return pGVar7;
    }
    iVar1 = Vec_IntEntry(p_01,iVar8);
    pGVar5 = Gia_ManObj(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      iVar1 = p_01->nSize;
      goto LAB_0047f479;
    }
    iVar1 = Gia_ObjFanin0Copy(pGVar5);
    Gia_ManAppendCo(p_11,iVar1);
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_SuperBuildTents( Gia_Man_t * p, Vec_Int_t ** pvMap )
{
    Vec_Int_t * vIns      = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts     = Vec_IntAlloc( 1000 );
    Vec_Int_t * vFlops    = Vec_IntAlloc( 1000 );
    Vec_Int_t * vObjs     = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimIns   = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimCuts  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimFlops = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimObjs  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vRankIns  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vRankCuts = Vec_IntAlloc( 1000 );
    Vec_Int_t * vMap      = Vec_IntAlloc( 1000 );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, r, Entry, Rank, iPrev, iThis = 0;
    // collect internal nodes
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vFlops, Gia_ObjId(p, pObj) );
    Gia_ManCleanMark01( p );
    for ( Rank = 0; iThis < Vec_IntEntryLast(vFlops); Rank++ )
    {
        Vec_IntPush( vLimIns,   Vec_IntSize(vIns)   );
        Vec_IntPush( vLimCuts,  Vec_IntSize(vCuts)  );
        Vec_IntPush( vLimFlops, Vec_IntSize(vFlops) );
        Vec_IntPush( vLimObjs,  Vec_IntSize(vObjs)  );
        iPrev = iThis;
        iThis = Vec_IntEntryLast(vFlops);
        Vec_IntForEachEntryStartStop( vFlops, Entry, i, iPrev, iThis )
        {
            Gia_ManIncrementTravId( p );
            Bmc_SuperBuildTents_rec( p, Gia_ObjFaninId0(Gia_ManObj(p, iPrev), iPrev), vIns, vCuts, vFlops, vObjs, vRankIns, vRankCuts, Rank );
        }
    }
    Gia_ManCleanMark01( p );
    Vec_IntPush( vLimIns,   Vec_IntSize(vIns)   );
    Vec_IntPush( vLimCuts,  Vec_IntSize(vCuts)  );
    Vec_IntPush( vLimFlops, Vec_IntSize(vFlops) );
    Vec_IntPush( vLimObjs,  Vec_IntSize(vObjs)  );
    // create new GIA
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachObjVec( vCuts, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    for ( r = Rank; r >= 0; r-- )
    {
        Vec_IntForEachEntryStartStop( vFlops, Entry, i, Vec_IntEntry(vLimFlops, r), Vec_IntEntry(vLimFlops, r+1) )
        {
            pObj = Gia_ManObj(p, Entry);
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
        Vec_IntForEachEntryStartStop( vObjs, Entry, i, Vec_IntEntry(vLimObjs, r), Vec_IntEntry(vLimObjs, r+1) )
        {
            pObj = Gia_ManObj(p, Entry);
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
    }
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachObjVec( vCuts, p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vCuts) );

    // create map
    Vec_IntForEachEntryTwo( vIns, vRankIns, Entry, Rank, i )
        Vec_IntPushTwo( vMap, Entry, Rank );
    Vec_IntForEachEntryTwo( vCuts, vRankCuts, Entry, Rank, i )
        Vec_IntPushTwo( vMap, Entry, Rank );

    Vec_IntFree( vIns   );
    Vec_IntFree( vCuts  );
    Vec_IntFree( vFlops );
    Vec_IntFree( vObjs  );

    Vec_IntFree( vLimIns   );
    Vec_IntFree( vLimCuts  );
    Vec_IntFree( vLimFlops );
    Vec_IntFree( vLimObjs  );

    Vec_IntFree( vRankIns  );
    Vec_IntFree( vRankCuts  );

    if ( pvMap )
        *pvMap = vMap;
    else
        Vec_IntFree( vMap );

    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}